

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void write_io(Emulator *e,MaskedAddress addr,u8 value)

{
  SGB *pSVar1;
  EmulatorEvent *pEVar2;
  ushort uVar3;
  undefined2 uVar4;
  PPUMode PVar5;
  DmaState DVar6;
  Bool BVar7;
  TimaState TVar8;
  SGB *pSVar9;
  EmulatorState *pEVar10;
  byte bVar11;
  byte pal;
  Address AVar12;
  RGBA RVar13;
  Bool BVar14;
  ulong uVar15;
  RGBA *pRVar16;
  byte bVar17;
  byte bVar18;
  JoypadSelect JVar19;
  SgbMask SVar20;
  size_t i;
  long lVar21;
  byte bVar22;
  Bool BVar23;
  SgbState SVar24;
  uint uVar25;
  ulong uVar26;
  size_t __n;
  ulong uVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  undefined6 in_register_00000032;
  bool bVar31;
  uint uVar32;
  uint uVar33;
  int iVar34;
  uint uVar35;
  byte bVar36;
  uint uVar37;
  ColorPalettes *pCVar38;
  u8 *puVar39;
  RGBA *pRVar40;
  RGBA *pRVar41;
  int x;
  PaletteType type;
  long lVar42;
  uint uVar43;
  bool bVar44;
  bool bVar45;
  u8 *local_70;
  
  iVar30 = (int)CONCAT62(in_register_00000032,addr);
  switch(iVar30) {
  case 0x40:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    BVar7 = (e->state).ppu.lcdc.display;
    (e->state).ppu.lcdc.display = (uint)(value >> 7);
    (e->state).ppu.lcdc.window_tile_map_select = value >> 6 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.window_display = value >> 5 & TRUE;
    (e->state).ppu.lcdc.bg_tile_data_select = value >> 4 & TILE_DATA_8000_8FFF;
    (e->state).ppu.lcdc.bg_tile_map_select = value >> 3 & TILE_MAP_9C00_9FFF;
    (e->state).ppu.lcdc.obj_size = value >> 2 & OBJ_SIZE_8X16;
    (e->state).ppu.lcdc.obj_display = value >> 1 & TRUE;
    (e->state).ppu.lcdc.bg_display = value & TRUE;
    if (BVar7 == value >> 7) {
      return;
    }
    (e->state).ppu.stat.mode = PPU_MODE_HBLANK;
    (e->state).ppu.line_y = '\0';
    (e->state).ppu.ly = '\0';
    if ((char)value < '\0') {
      if ((e->state).ppu.lyc == '\0') {
        (e->state).ppu.stat.y_compare.trigger = TRUE;
        (e->state).ppu.stat.new_ly_eq_lyc = TRUE;
      }
      else {
        (e->state).ppu.stat.y_compare.trigger = FALSE;
        (e->state).ppu.stat.new_ly_eq_lyc = FALSE;
        (e->state).ppu.stat.ly_eq_lyc = FALSE;
      }
      (e->state).ppu.state = PPU_STATE_LCD_ON_MODE2;
      (e->state).ppu.state_ticks = 0x50;
      (e->state).ppu.line_start_ticks = (e->state).ticks - 5 & 0xfffffffffffffffc;
      (e->state).ppu.display_delay_frames = '\x04';
      (e->state).ppu.stat.trigger_mode = PPU_MODE_MODE2;
    }
    else {
      if ((e->state).is_sgb == FALSE) {
        memset(e->frame_buffer,0xff,0x16800);
      }
      else {
        SVar20 = (e->state).sgb.mask;
        if (SVar20 == SGB_MASK_COLOR0) {
          RVar13 = (e->state).sgb.screen_pal[0].color[0];
LAB_00107bb9:
          bVar31 = false;
        }
        else {
          RVar13 = 0xff000000;
          if ((SVar20 != SGB_MASK_FREEZE) && (SVar20 != SGB_MASK_CANCEL)) goto LAB_00107bb9;
          bVar31 = true;
        }
        if (!bVar31) {
          lVar21 = 0;
          do {
            e->frame_buffer[lVar21] = RVar13;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x5a00);
        }
      }
      pEVar2 = &(e->state).event;
      *(byte *)pEVar2 = (byte)*pEVar2 | 1;
    }
    uVar15 = 0xffffffffffffffff;
    if ((char)value < '\0') goto LAB_00107bea;
    goto LAB_00107bfa;
  case 0x41:
    ppu_synchronize(e);
    BVar14 = value >> 4 & TRUE;
    BVar23 = value >> 3 & TRUE;
    BVar7 = (e->state).ppu.lcdc.display;
    if (BVar7 != FALSE) {
      PVar5 = (e->state).ppu.stat.trigger_mode;
      if (PVar5 == PPU_MODE_HBLANK) {
        bVar31 = (e->state).ppu.stat.hblank.irq == FALSE;
      }
      else {
        bVar31 = false;
      }
      if (PVar5 == PPU_MODE_VBLANK) {
        bVar44 = (e->state).ppu.stat.vblank.irq == FALSE;
      }
      else {
        bVar44 = false;
      }
      if ((e->state).ppu.stat.new_ly_eq_lyc == FALSE) {
        bVar45 = false;
      }
      else {
        bVar45 = (e->state).ppu.stat.y_compare.irq == FALSE;
      }
      if ((e->state).is_cgb != FALSE) {
        bVar31 = (bool)(bVar31 & (byte)BVar23);
        bVar44 = (bool)(bVar44 & (byte)BVar14);
      }
      if (((e->state).ppu.stat.if_ == FALSE) && ((bVar31 != false || bVar44 != false) || bVar45)) {
        puVar39 = &(e->state).interrupt.new_if;
        *puVar39 = *puVar39 | 2;
        puVar39 = &(e->state).interrupt.if_;
        *puVar39 = *puVar39 | 2;
        (e->state).ppu.stat.if_ = TRUE;
      }
    }
    (e->state).ppu.stat.y_compare.irq = value >> 6 & TRUE;
    (e->state).ppu.stat.mode2.irq = value >> 5 & TRUE;
    (e->state).ppu.stat.vblank.irq = BVar14;
    (e->state).ppu.stat.hblank.irq = BVar23;
    goto joined_r0x00107626;
  case 0x42:
    ppu_mode3_synchronize(e);
    (e->state).ppu.scy = value;
    break;
  case 0x43:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.scx = value;
    break;
  case 0x44:
  case 0x4c:
  case 0x4e:
  case 0x50:
  case 0x57:
  case 0x58:
  case 0x59:
  case 0x5a:
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
  case 0x61:
  case 0x62:
  case 99:
  case 100:
  case 0x65:
  case 0x66:
  case 0x67:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x6f:
    break;
  case 0x45:
    ppu_synchronize(e);
    (e->state).ppu.lyc = value;
    if ((e->state).ppu.lcdc.display != FALSE) {
      check_ly_eq_lyc(e,TRUE);
      check_stat(e);
    }
    BVar7 = (e->state).ppu.lcdc.display;
joined_r0x00107626:
    if (BVar7 == FALSE) {
      uVar15 = 0xffffffffffffffff;
    }
    else {
LAB_00107bea:
      uVar15 = (ulong)(e->state).ppu.state_ticks + (e->state).ppu.sync_ticks;
    }
LAB_00107bfa:
    (e->state).ppu.next_intr_ticks = uVar15;
    uVar27 = (e->state).serial.next_intr_ticks;
    uVar26 = (e->state).timer.next_intr_ticks;
    if (uVar27 < uVar26) {
      uVar26 = uVar27;
    }
    if (uVar15 <= uVar26) {
      uVar26 = uVar15;
    }
    (e->state).next_intr_ticks = uVar26;
    break;
  case 0x46:
    dma_synchronize(e);
    (e->state).dma.sync_ticks = (e->state).ticks;
    (e->state).dma.tick_count = 0;
    DVar6 = (e->state).dma.state;
    (e->state).dma.state = DVar6 + (DVar6 == DMA_INACTIVE);
    (e->state).dma.source = (ushort)value << 8;
    break;
  case 0x47:
  case 0x48:
  case 0x49:
    type = addr - 0x47;
    ppu_mode3_synchronize(e);
    (e->state).ppu.pal[type].color[3] = (uint)(value >> 6);
    (e->state).ppu.pal[type].color[2] = value >> 4 & COLOR_BLACK;
    (e->state).ppu.pal[type].color[1] = value >> 2 & COLOR_BLACK;
    (e->state).ppu.pal[type].color[0] = value & COLOR_BLACK;
    update_bw_palette_rgba(e,type);
    return;
  case 0x4a:
    ppu_synchronize(e);
    ppu_mode3_synchronize(e);
    (e->state).ppu.wy = value;
    break;
  case 0x4b:
    ppu_mode3_synchronize(e);
    (e->state).ppu.wx = value;
    break;
  case 0x4d:
    if ((e->state).is_cgb != FALSE) {
      (e->state).cpu_speed.switching = (uint)(value & 1);
    }
    break;
  case 0x4f:
    if ((e->state).is_cgb != FALSE) {
      (e->state).vram.bank = value & 1;
      (e->state).vram.offset = (ushort)(value & 1) << 0xd;
    }
    break;
  case 0x51:
    if ((e->state).is_cgb != FALSE) {
      *(u8 *)((long)&(e->state).hdma.source + 1) = value;
    }
    break;
  case 0x52:
    if ((e->state).is_cgb != FALSE) {
      *(byte *)&(e->state).hdma.source = value & 0xf0;
    }
    break;
  case 0x53:
    if ((e->state).is_cgb != FALSE) {
      *(u8 *)((long)&(e->state).hdma.dest + 1) = value;
    }
    break;
  case 0x54:
    if ((e->state).is_cgb != FALSE) {
      *(byte *)&(e->state).hdma.dest = value & 0xf0;
    }
    break;
  case 0x55:
    if ((e->state).is_cgb != FALSE) {
      if (((e->state).hdma.mode == HDMA_TRANSFER_MODE_HDMA) &&
         (bVar18 = (e->state).hdma.blocks, -1 < (char)bVar18)) {
        if ((char)value < '\0') {
          (e->state).hdma.blocks = value & 0x7f;
          (e->state).hdma.mode = HDMA_TRANSFER_MODE_HDMA;
        }
        else {
          (e->state).hdma.blocks = bVar18 | value | 0x80;
        }
      }
      else {
        (e->state).hdma.mode = (uint)(value >> 7);
        (e->state).hdma.blocks = value & 0x7f;
      }
      if ((e->state).hdma.mode == HDMA_TRANSFER_MODE_GDMA) {
        (e->state).hdma.state = DMA_ACTIVE;
      }
    }
    break;
  case 0x56:
    if ((e->state).is_cgb != FALSE) {
      (e->state).infrared.write = value & TRUE;
      (e->state).infrared.enabled = (uint)(value >> 6);
    }
    break;
  case 0x68:
  case 0x6a:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      pCVar38 = &(e->state).ppu.bgcp;
      if (addr != 0x68) {
        pCVar38 = &(e->state).ppu.obcp;
      }
      pCVar38->index = value & 0x3f;
      pCVar38->auto_increment = (uint)(value >> 7);
    }
    break;
  case 0x69:
  case 0x6b:
    if ((e->state).is_cgb != FALSE) {
      ppu_mode3_synchronize(e);
      pCVar38 = &(e->state).ppu.obcp;
      if (addr == 0x69) {
        pCVar38 = &(e->state).ppu.bgcp;
      }
      pCVar38->data[pCVar38->index] = value;
      bVar18 = pCVar38->index;
      RVar13 = unpack_cgb_color(e,CONCAT11(pCVar38->data[(ulong)bVar18 | 1],
                                           pCVar38->data[bVar18 & 0xfffffffe]));
      *(RGBA *)((long)pCVar38->palettes[0].color +
               (ulong)((uint)bVar18 + (uint)bVar18 & 0xc) +
               (ulong)((uint)bVar18 + (uint)bVar18 & 0x70)) = RVar13;
      if (pCVar38->auto_increment != FALSE) {
        pCVar38->index = bVar18 + 1 & 0x3f;
      }
    }
    break;
  case 0x70:
    if ((e->state).is_cgb != FALSE) {
      (e->state).wram.bank = value & 7;
      AVar12 = 0x1000;
      if ((value & 7) != 0) {
        AVar12 = (ushort)(value & 7) << 0xc;
      }
      (e->state).wram.offset = AVar12;
    }
    break;
  default:
    switch(CONCAT62(in_register_00000032,addr) & 0xffffffff) {
    case 0:
      bVar18 = value >> 4 & 3;
      JVar19 = value >> 4 & JOYPAD_SELECT_NONE;
      (e->state).joyp.joypad_select = JVar19;
      if ((e->state).is_sgb == FALSE) goto switchD_00107db8_caseD_8;
      bVar31 = true;
      switch((e->state).sgb.state) {
      case SGB_STATE_IDLE:
        if (bVar18 == 0) {
          (e->state).sgb.bits_read = '\0';
          bVar11 = (e->state).sgb.current_packet + 1;
          (e->state).sgb.current_packet = bVar11;
          SVar24 = SGB_STATE_WAIT_BIT;
          bVar44 = true;
          if ((e->state).sgb.packet_count <= bVar11) {
            (e->state).sgb.current_packet = '\0';
            (e->state).sgb.packet_count = '\0';
            (e->state).sgb.data[0] = '\0';
            (e->state).sgb.data[1] = '\0';
            (e->state).sgb.data[2] = '\0';
            (e->state).sgb.data[3] = '\0';
            (e->state).sgb.data[4] = '\0';
            (e->state).sgb.data[5] = '\0';
            (e->state).sgb.data[6] = '\0';
            (e->state).sgb.data[7] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[8] = '\0';
            (pEVar10->sgb).data[9] = '\0';
            (pEVar10->sgb).data[10] = '\0';
            (pEVar10->sgb).data[0xb] = '\0';
            (pEVar10->sgb).data[0xc] = '\0';
            (pEVar10->sgb).data[0xd] = '\0';
            (pEVar10->sgb).data[0xe] = '\0';
            (pEVar10->sgb).data[0xf] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x10] = '\0';
            (pEVar10->sgb).data[0x11] = '\0';
            (pEVar10->sgb).data[0x12] = '\0';
            (pEVar10->sgb).data[0x13] = '\0';
            (pEVar10->sgb).data[0x14] = '\0';
            (pEVar10->sgb).data[0x15] = '\0';
            (pEVar10->sgb).data[0x16] = '\0';
            (pEVar10->sgb).data[0x17] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x18] = '\0';
            (pEVar10->sgb).data[0x19] = '\0';
            (pEVar10->sgb).data[0x1a] = '\0';
            (pEVar10->sgb).data[0x1b] = '\0';
            (pEVar10->sgb).data[0x1c] = '\0';
            (pEVar10->sgb).data[0x1d] = '\0';
            (pEVar10->sgb).data[0x1e] = '\0';
            (pEVar10->sgb).data[0x1f] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x20] = '\0';
            (pEVar10->sgb).data[0x21] = '\0';
            (pEVar10->sgb).data[0x22] = '\0';
            (pEVar10->sgb).data[0x23] = '\0';
            (pEVar10->sgb).data[0x24] = '\0';
            (pEVar10->sgb).data[0x25] = '\0';
            (pEVar10->sgb).data[0x26] = '\0';
            (pEVar10->sgb).data[0x27] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x28] = '\0';
            (pEVar10->sgb).data[0x29] = '\0';
            (pEVar10->sgb).data[0x2a] = '\0';
            (pEVar10->sgb).data[0x2b] = '\0';
            (pEVar10->sgb).data[0x2c] = '\0';
            (pEVar10->sgb).data[0x2d] = '\0';
            (pEVar10->sgb).data[0x2e] = '\0';
            (pEVar10->sgb).data[0x2f] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x30] = '\0';
            (pEVar10->sgb).data[0x31] = '\0';
            (pEVar10->sgb).data[0x32] = '\0';
            (pEVar10->sgb).data[0x33] = '\0';
            (pEVar10->sgb).data[0x34] = '\0';
            (pEVar10->sgb).data[0x35] = '\0';
            (pEVar10->sgb).data[0x36] = '\0';
            (pEVar10->sgb).data[0x37] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x38] = '\0';
            (pEVar10->sgb).data[0x39] = '\0';
            (pEVar10->sgb).data[0x3a] = '\0';
            (pEVar10->sgb).data[0x3b] = '\0';
            (pEVar10->sgb).data[0x3c] = '\0';
            (pEVar10->sgb).data[0x3d] = '\0';
            (pEVar10->sgb).data[0x3e] = '\0';
            (pEVar10->sgb).data[0x3f] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x40] = '\0';
            (pEVar10->sgb).data[0x41] = '\0';
            (pEVar10->sgb).data[0x42] = '\0';
            (pEVar10->sgb).data[0x43] = '\0';
            (pEVar10->sgb).data[0x44] = '\0';
            (pEVar10->sgb).data[0x45] = '\0';
            (pEVar10->sgb).data[0x46] = '\0';
            (pEVar10->sgb).data[0x47] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x48] = '\0';
            (pEVar10->sgb).data[0x49] = '\0';
            (pEVar10->sgb).data[0x4a] = '\0';
            (pEVar10->sgb).data[0x4b] = '\0';
            (pEVar10->sgb).data[0x4c] = '\0';
            (pEVar10->sgb).data[0x4d] = '\0';
            (pEVar10->sgb).data[0x4e] = '\0';
            (pEVar10->sgb).data[0x4f] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x50] = '\0';
            (pEVar10->sgb).data[0x51] = '\0';
            (pEVar10->sgb).data[0x52] = '\0';
            (pEVar10->sgb).data[0x53] = '\0';
            (pEVar10->sgb).data[0x54] = '\0';
            (pEVar10->sgb).data[0x55] = '\0';
            (pEVar10->sgb).data[0x56] = '\0';
            (pEVar10->sgb).data[0x57] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x58] = '\0';
            (pEVar10->sgb).data[0x59] = '\0';
            (pEVar10->sgb).data[0x5a] = '\0';
            (pEVar10->sgb).data[0x5b] = '\0';
            (pEVar10->sgb).data[0x5c] = '\0';
            (pEVar10->sgb).data[0x5d] = '\0';
            (pEVar10->sgb).data[0x5e] = '\0';
            (pEVar10->sgb).data[0x5f] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x60] = '\0';
            (pEVar10->sgb).data[0x61] = '\0';
            (pEVar10->sgb).data[0x62] = '\0';
            (pEVar10->sgb).data[99] = '\0';
            (pEVar10->sgb).data[100] = '\0';
            (pEVar10->sgb).data[0x65] = '\0';
            (pEVar10->sgb).data[0x66] = '\0';
            (pEVar10->sgb).data[0x67] = '\0';
            pEVar10 = &e->state;
            (pEVar10->sgb).data[0x68] = '\0';
            (pEVar10->sgb).data[0x69] = '\0';
            (pEVar10->sgb).data[0x6a] = '\0';
            (pEVar10->sgb).data[0x6b] = '\0';
            (pEVar10->sgb).data[0x6c] = '\0';
            (pEVar10->sgb).data[0x6d] = '\0';
            (pEVar10->sgb).data[0x6e] = '\0';
            (pEVar10->sgb).data[0x6f] = '\0';
          }
          goto LAB_00107c45;
        }
        break;
      case SGB_STATE_WAIT_BIT:
        SVar24 = SGB_STATE_IDLE;
        bVar44 = true;
        if (bVar18 == 3) {
          SVar24 = (e->state).sgb.bits_read >> 7 | SGB_STATE_READ_BIT;
        }
        goto LAB_00107c45;
      case SGB_STATE_READ_BIT:
        if (bVar18 == 2) {
          puVar39 = &(e->state).sgb.bits_read;
          *puVar39 = *puVar39 + '\x01';
        }
        else {
          if (JVar19 != JOYPAD_SELECT_BUTTONS) break;
          bVar11 = (e->state).sgb.bits_read;
          puVar39 = (e->state).sgb.data +
                    ((uint)(bVar11 >> 3) | (uint)(e->state).sgb.current_packet << 4);
          *puVar39 = *puVar39 | '\x01' << (bVar11 & 7);
          puVar39 = &(e->state).sgb.bits_read;
          *puVar39 = *puVar39 + '\x01';
        }
        SVar24 = SGB_STATE_WAIT_BIT;
        bVar44 = true;
        goto LAB_00107c45;
      case SGB_STATE_STOP_BIT:
        SVar24 = (uint)(bVar18 == 2) << 2;
        bVar44 = true;
LAB_00107c45:
        bVar31 = bVar44;
        (e->state).sgb.state = SVar24;
        break;
      case SGB_STATE_STOP_WAIT:
        SVar24 = SGB_STATE_IDLE;
        bVar44 = false;
        if (bVar18 == 3) goto LAB_00107c45;
      }
      if ((bVar18 < 2) && ((e->state).sgb.player_incremented == FALSE)) {
        (e->state).sgb.player_incremented = TRUE;
      }
      else if (bVar18 == 3) {
        if ((e->state).sgb.player_incremented != FALSE) {
          (e->state).sgb.current_player =
               (e->state).sgb.current_player + 1 & (e->state).sgb.player_mask;
        }
        (e->state).sgb.player_incremented = FALSE;
      }
      if (bVar31) goto switchD_00107db8_caseD_8;
      bVar18 = (e->state).sgb.current_packet;
      if (bVar18 == 0) {
        (e->state).sgb.packet_count = (e->state).sgb.data[0] & 7;
      }
      if ((e->state).sgb.packet_count - 1 != (uint)bVar18) goto switchD_00107db8_caseD_8;
      bVar18 = (e->state).sgb.data[0] >> 3;
      uVar15 = (ulong)(uint)bVar18;
      local_70 = (u8 *)0x0;
      if ((bVar18 < 0x16) && ((0x380800U >> (uint)bVar18 & 1) != 0)) {
        bVar11 = (e->state).vram.data
                 [(ulong)((e->state).ppu.lcdc.bg_tile_map_select != TILE_MAP_9800_9BFF) * 0x400 +
                  0x1800];
        if ((e->state).ppu.lcdc.bg_tile_data_select == TILE_DATA_8800_97FF) {
          uVar37 = (char)bVar11 * -0x10 + 0x800U & 0xffff;
          memcpy(do_sgb_s_temp_xfer_buffer,
                 (e->state).vram.data + ((char)bVar11 * 0x10 + 0x1000U & 0xffff),(ulong)uVar37);
          local_70 = do_sgb_s_temp_xfer_buffer;
          memcpy(do_sgb_s_temp_xfer_buffer + uVar37,(e->state).vram.data + 0x800,
                 (ulong)(0x1000 - uVar37));
        }
        else {
          local_70 = (e->state).vram.data + (ulong)bVar11 * 0x10;
        }
      }
      if (0x17 < bVar18) goto switchD_00107db8_caseD_8;
      pSVar1 = &(e->state).sgb;
      switch(uVar15) {
      case 0:
      case 1:
      case 2:
      case 3:
        iVar30 = *(int *)(do_sgb_s_pals + uVar15 * 8 + 4);
        set_sgb_palette(e,*(int *)(do_sgb_s_pals + uVar15 * 8),(e->state).sgb.data[1],
                        (e->state).sgb.data[2],(e->state).sgb.data[3],(e->state).sgb.data[4],
                        (e->state).sgb.data[5],(e->state).sgb.data[6],(e->state).sgb.data[7],
                        (e->state).sgb.data[8]);
        set_sgb_palette(e,iVar30,(e->state).sgb.data[1],(e->state).sgb.data[2],
                        (e->state).sgb.data[9],(e->state).sgb.data[10],(e->state).sgb.data[0xb],
                        (e->state).sgb.data[0xc],(e->state).sgb.data[0xd],(e->state).sgb.data[0xe]);
        break;
      case 4:
        bVar18 = (e->state).sgb.data[1];
        uVar37 = (int)((uint)(e->state).sgb.packet_count * 0x10 + -2) / 6;
        if ((int)(uint)bVar18 <= (int)uVar37) {
          uVar37 = (uint)bVar18;
        }
        if (0 < (int)uVar37) {
          uVar15 = 0;
          do {
            bVar18 = (e->state).sgb.data[uVar15 * 6 + 2];
            bVar11 = (e->state).sgb.data[uVar15 * 6 + 3];
            bVar17 = (e->state).sgb.data[uVar15 * 6 + 4];
            bVar36 = (e->state).sgb.data[uVar15 * 6 + 5];
            uVar33 = (uint)(e->state).sgb.data[uVar15 * 6 + 6];
            bVar22 = (e->state).sgb.data[uVar15 * 6 + 7];
            uVar35 = (uint)bVar22;
            if ((bVar18 & 1) != 0) {
              set_sgb_attr_block(e,(uint)bVar17,(uint)bVar36,uVar33,(uint)bVar22,bVar11 & 3);
            }
            if ((bVar18 & 2) != 0) {
              pal = bVar11 >> 2 & 3;
              uVar43 = (uint)bVar36;
              set_sgb_attr_block(e,(uint)bVar17,uVar43,uVar33,uVar43,pal);
              uVar25 = (uint)bVar22;
              set_sgb_attr_block(e,(uint)bVar17,uVar43,(uint)bVar17,uVar25,pal);
              set_sgb_attr_block(e,(uint)bVar17,uVar25,uVar33,uVar25,pal);
              set_sgb_attr_block(e,uVar33,(uint)bVar36,uVar33,uVar25,pal);
            }
            if ((bVar18 & 4) != 0) {
              uVar43 = bVar11 >> 4 & 3;
              if (bVar36 != 0) {
                uVar25 = 0;
                iVar30 = 0;
                do {
                  iVar34 = 0;
                  uVar32 = uVar25;
                  do {
                    bVar18 = (byte)iVar34 & 6;
                    (e->state).sgb.attr_map[uVar32 >> 2] =
                         (byte)(uVar43 << (bVar18 ^ 6)) |
                         (e->state).sgb.attr_map[uVar32 >> 2] & (byte)(-0xc1 >> bVar18);
                    iVar34 = iVar34 + 2;
                    uVar32 = uVar32 + 1;
                  } while (iVar34 != 0x28);
                  uVar25 = uVar25 + 0x14;
                  bVar31 = iVar30 != bVar36 - 1;
                  iVar30 = iVar30 + 1;
                } while (bVar31);
              }
              set_sgb_attr_block(e,0,(uint)bVar36,bVar17 - 1,(uint)bVar22,(u8)uVar43);
              if (bVar22 < 0x11) {
                uVar25 = (uint)bVar22 * 0x14;
                do {
                  uVar25 = uVar25 + 0x14;
                  uVar35 = uVar35 + 1;
                  iVar30 = 0;
                  uVar32 = uVar25;
                  do {
                    bVar18 = (byte)iVar30 & 6;
                    (e->state).sgb.attr_map[uVar32 >> 2] =
                         (byte)(uVar43 << (bVar18 ^ 6)) |
                         (e->state).sgb.attr_map[uVar32 >> 2] & (byte)(-0xc1 >> bVar18);
                    iVar30 = iVar30 + 2;
                    uVar32 = uVar32 + 1;
                  } while (iVar30 != 0x28);
                } while (uVar35 != 0x11);
              }
              set_sgb_attr_block(e,uVar33 + 1,(uint)bVar36,0x13,(uint)bVar22,(u8)uVar43);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar37);
        }
        break;
      case 5:
        bVar18 = (e->state).sgb.data[1];
        uVar37 = (uint)(e->state).sgb.packet_count * 0x10 - 2;
        if ((int)(uint)bVar18 <= (int)uVar37) {
          uVar37 = (uint)bVar18;
        }
        if (0 < (int)uVar37) {
          uVar15 = 0;
          do {
            bVar18 = (e->state).sgb.data[uVar15 + 2];
            uVar35 = bVar18 & 0x1f;
            uVar33 = bVar18 >> 5 & 3;
            if ((char)bVar18 < '\0') {
              uVar35 = uVar35 * 0x14;
              iVar30 = 0;
              do {
                bVar18 = (byte)iVar30 & 6;
                (e->state).sgb.attr_map[uVar35 >> 2] =
                     (byte)(uVar33 << (bVar18 ^ 6)) |
                     (e->state).sgb.attr_map[uVar35 >> 2] & (byte)(-0xc1 >> bVar18);
                iVar30 = iVar30 + 2;
                uVar35 = uVar35 + 1;
              } while (iVar30 != 0x28);
            }
            else {
              bVar18 = (char)uVar35 * '\x02' & 6;
              lVar21 = (ulong)(uVar35 >> 2) + 0x3340a;
              lVar28 = 0;
              do {
                (e->state).sgb.attr_map[lVar28 + lVar21 + -0x3340a] =
                     (e->state).sgb.attr_map[lVar28 + lVar21 + -0x3340a] & (byte)(-0xc1 >> bVar18) |
                     (byte)(uVar33 << (bVar18 ^ 6));
                lVar28 = lVar28 + 5;
              } while (lVar28 != 0x5a);
            }
            uVar15 = uVar15 + 1;
          } while (uVar15 != uVar37);
        }
        break;
      case 6:
        bVar18 = (e->state).sgb.data[1];
        bVar36 = bVar18 >> 2 & 3;
        bVar17 = bVar18 >> 4 & 3;
        bVar11 = (e->state).sgb.data[2];
        uVar37 = (uint)bVar11;
        iVar30 = bVar11 + 1;
        if ((bVar18 & 0x40) == 0) {
          set_sgb_attr_block(e,0,0,bVar11 - 1,0x11,bVar17);
          set_sgb_attr_block(e,uVar37,0,(uint)bVar11,0x11,bVar36);
          iVar34 = iVar30;
          iVar30 = 0;
        }
        else {
          set_sgb_attr_block(e,0,0,0x13,bVar11 - 1,bVar17);
          set_sgb_attr_block(e,0,uVar37,0x13,uVar37,bVar36);
          iVar34 = 0;
        }
        set_sgb_attr_block(e,iVar34,iVar30,0x13,0x11,bVar18 & 3);
        break;
      case 7:
        bVar31 = (e->state).sgb.data[5] == '\0';
        uVar37 = (uint)(e->state).sgb.packet_count * 0x40 - 0x18;
        uVar35 = (uint)*(ushort *)((e->state).sgb.data + 3);
        if ((int)uVar35 < (int)uVar37) {
          uVar37 = uVar35;
        }
        if (0 < (int)uVar37) {
          uVar15 = 0x168;
          if ((int)uVar37 < 0x168) {
            uVar15 = (ulong)uVar37;
          }
          bVar18 = (e->state).sgb.data[1];
          uVar35 = 4;
          if ((int)uVar37 < 4) {
            uVar35 = uVar37;
          }
          uVar37 = 1;
          if (1 < (int)uVar35) {
            uVar37 = uVar35;
          }
          bVar11 = (e->state).sgb.data[2];
          uVar27 = 0;
          do {
            bVar17 = (e->state).sgb.data[(uVar27 >> 2) + 6];
            iVar30 = 6;
            do {
              bVar36 = bVar18 + bVar31;
              bVar22 = (bVar11 + !bVar31 + '\x01') - (bVar36 < 0x14);
              if (0x13 < bVar36) {
                bVar36 = 0;
              }
              set_sgb_attr_block(e,(uint)bVar18,(uint)bVar11,(uint)bVar18,(uint)bVar11,
                                 bVar17 >> ((byte)iVar30 & 0x1f));
              bVar11 = 0;
              bVar18 = bVar36 + 1;
              if (0x12 < bVar36) {
                bVar18 = 0;
              }
              if (bVar22 < 0x12) {
                bVar18 = bVar36;
                bVar11 = bVar22;
              }
              iVar34 = iVar30 + uVar37 * 2;
              iVar30 = iVar30 + -2;
            } while (iVar34 != 8);
            uVar27 = uVar27 + 4;
          } while (uVar27 < uVar15);
        }
        break;
      case 10:
        unpack_sgb_palette_ram(e,3,(e->state).sgb.data[7],(e->state).sgb.data[8]);
        unpack_sgb_palette_ram(e,2,(e->state).sgb.data[5],(e->state).sgb.data[6]);
        unpack_sgb_palette_ram(e,1,(e->state).sgb.data[3],(e->state).sgb.data[4]);
        unpack_sgb_palette_ram(e,0,(e->state).sgb.data[1],(e->state).sgb.data[2]);
        bVar18 = (e->state).sgb.data[9];
        if (-1 < (char)bVar18) break;
        if ((byte)(bVar18 & 0x3f) < 0x2d) {
          memcpy((e->state).sgb.attr_map,(e->state).sgb.attr_ram + (ulong)(bVar18 & 0x3f) * 0x5a,
                 0x5a);
        }
        goto joined_r0x001086b3;
      case 0xb:
        puVar39 = (e->state).sgb.pal_ram;
        goto LAB_001086fc;
      case 0x11:
        (e->state).sgb.player_mask = (e->state).sgb.data[1] & 3;
        break;
      case 0x13:
        puVar39 = pSVar1->chr_ram + (((e->state).sgb.data[1] & 1) << 0xc);
LAB_001086fc:
        __n = 0x1000;
LAB_00108701:
        memcpy(puVar39,local_70,__n);
        break;
      case 0x14:
        pRVar16 = (e->state).sgb.border_pal[0] + 1;
        puVar39 = local_70 + 0x803;
        lVar21 = 0;
        do {
          (e->state).sgb.border_pal[lVar21][0] = 0;
          lVar28 = 0;
          do {
            RVar13 = unpack_cgb_color(e,*(u16 *)(puVar39 + lVar28 * 2 + -1));
            pRVar16[lVar28] = RVar13;
            lVar28 = lVar28 + 1;
          } while (lVar28 != 0xf);
          lVar21 = lVar21 + 1;
          pRVar16 = pRVar16 + 0x10;
          puVar39 = puVar39 + 0x20;
        } while (lVar21 != 4);
        pRVar16 = e->sgb_frame_buffer;
        lVar21 = 0;
        do {
          lVar28 = 0;
          pRVar40 = pRVar16;
          do {
            lVar29 = lVar21 * 0x40 + lVar28 * 2;
            bVar18 = local_70[lVar29 + 1];
            pSVar9 = (SGB *)((e->state).sgb.chr_ram + 0xe);
            if (-1 < (char)bVar18) {
              pSVar9 = pSVar1;
            }
            puVar39 = pSVar9->chr_ram + (ulong)local_70[lVar29] * 0x20;
            lVar29 = 0;
            pRVar41 = pRVar40;
            do {
              bVar11 = *puVar39;
              bVar17 = puVar39[1];
              bVar36 = puVar39[0x10];
              bVar22 = puVar39[0x11];
              if ((bVar18 & 0x40) == 0) {
                bVar11 = bVar11 << 4 | bVar11 >> 4;
                bVar11 = bVar11 >> 2 & 0x33 | (bVar11 & 0x33) << 2;
                bVar11 = bVar11 >> 1 & 0x55 | (bVar11 & 0x55) * '\x02';
                bVar17 = bVar17 << 4 | bVar17 >> 4;
                bVar17 = bVar17 >> 2 & 0x33 | (bVar17 & 0x33) << 2;
                bVar17 = bVar17 >> 1 & 0x55 | (bVar17 & 0x55) * '\x02';
                bVar36 = bVar36 << 4 | bVar36 >> 4;
                bVar36 = bVar36 >> 2 & 0x33 | (bVar36 & 0x33) << 2;
                bVar36 = bVar36 >> 1 & 0x55 | (bVar36 & 0x55) * '\x02';
                bVar22 = bVar22 << 4 | bVar22 >> 4;
                bVar22 = bVar22 >> 2 & 0x33 | (bVar22 & 0x33) << 2;
                bVar22 = bVar22 >> 1 & 0x55 | (bVar22 & 0x55) * '\x02';
              }
              uVar15 = (ulong)bVar22;
              lVar42 = 0;
              do {
                pRVar41[lVar42] =
                     *(RGBA *)((long)(e->state).sgb.border_pal[0] +
                              (ulong)(((uint)(bVar11 & 1) |
                                      ((uint)uVar15 & 1) * 8 + (bVar36 & 1) * 4) + (bVar17 & 1) * 2)
                              * 4 + (ulong)((bVar18 >> 2 & 3) << 6));
                bVar11 = bVar11 >> 1;
                bVar17 = bVar17 >> 1;
                bVar36 = bVar36 >> 1;
                uVar15 = uVar15 >> 1;
                lVar42 = lVar42 + 1;
              } while (lVar42 != 8);
              lVar29 = lVar29 + 1;
              puVar39 = puVar39 + (ulong)(-1 < (char)bVar18) * 4 + -2;
              pRVar41 = pRVar41 + 0x100;
            } while (lVar29 != 8);
            lVar28 = lVar28 + 1;
            pRVar40 = pRVar40 + 8;
          } while (lVar28 != 0x20);
          lVar21 = lVar21 + 1;
          pRVar16 = pRVar16 + 0x800;
        } while (lVar21 != 0x1c);
        SVar20 = (e->state).sgb.mask;
        if (SVar20 == SGB_MASK_COLOR0) {
          RVar13 = (e->state).sgb.screen_pal[0].color[0];
LAB_00108848:
          bVar31 = false;
        }
        else {
          RVar13 = 0xff000000;
          if ((SVar20 != SGB_MASK_FREEZE) && (SVar20 != SGB_MASK_CANCEL)) goto LAB_00108848;
          bVar31 = true;
        }
        if (!bVar31) {
          lVar21 = 0;
          do {
            e->frame_buffer[lVar21] = RVar13;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x5a00);
        }
        break;
      case 0x15:
        puVar39 = (e->state).sgb.attr_ram;
        __n = 0xfd2;
        goto LAB_00108701;
      case 0x16:
        bVar18 = (e->state).sgb.data[1];
        if ((byte)(bVar18 & 0x3f) < 0x2d) {
          memcpy((e->state).sgb.attr_map,(e->state).sgb.attr_ram + (ulong)(bVar18 & 0x3f) * 0x5a,
                 0x5a);
        }
joined_r0x001086b3:
        if ((bVar18 & 0x40) != 0) {
          (e->state).sgb.mask = SGB_MASK_CANCEL;
        }
        break;
      case 0x17:
        bVar18 = (e->state).sgb.data[1];
        SVar20 = (SgbMask)bVar18;
        if (SGB_MASK_COLOR0 < SVar20) break;
        (e->state).sgb.mask = SVar20;
        if (SVar20 == SGB_MASK_COLOR0) {
          RVar13 = (e->state).sgb.screen_pal[0].color[0];
LAB_00108871:
          bVar31 = false;
        }
        else {
          RVar13 = 0xff000000;
          if ((bVar18 != 1) && (bVar18 != 0)) goto LAB_00108871;
          bVar31 = true;
        }
        if (!bVar31) {
          lVar21 = 0;
          do {
            e->frame_buffer[lVar21] = RVar13;
            lVar21 = lVar21 + 1;
          } while (lVar21 != 0x5a00);
        }
      }
switchD_00107db8_caseD_8:
      check_joyp_intr(e);
      return;
    case 1:
      serial_synchronize(e);
      (e->state).serial.sb = value;
      break;
    case 2:
      serial_synchronize(e);
      (e->state).serial.transferring = (uint)(value >> 7);
      (e->state).serial.clock = value & SERIAL_CLOCK_INTERNAL;
      if ((char)value < '\0') {
        (e->state).serial.tick_count = 0;
        (e->state).serial.transferred_bits = '\0';
      }
      calculate_next_serial_intr(e);
      return;
    case 3:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
      break;
    case 4:
      timer_synchronize(e);
      if (((e->state).timer.on != FALSE) &&
         (((e->state).timer.div_counter & s_tima_mask[(e->state).timer.clock_select]) != 0)) {
        increment_tima(e);
      }
      (e->state).timer.div_counter = 0;
      goto LAB_001078f5;
    case 5:
      timer_synchronize(e);
      if ((e->state).timer.on == FALSE) {
        (e->state).timer.tima = value;
        return;
      }
      TVar8 = (e->state).timer.tima_state;
      if (TVar8 == TIMA_STATE_RESET) goto LAB_001078f5;
      if (TVar8 == TIMA_STATE_OVERFLOW) {
        (e->state).timer.tima_state = TIMA_STATE_NORMAL;
        puVar39 = &(e->state).interrupt.new_if;
        *puVar39 = *puVar39 & 0xfb;
      }
      goto LAB_00107799;
    case 6:
      timer_synchronize(e);
      (e->state).timer.tma = value;
      if (((e->state).timer.on == FALSE) || ((e->state).timer.tima_state != TIMA_STATE_RESET))
      goto LAB_001078f5;
LAB_00107799:
      (e->state).timer.tima = value;
LAB_001078f5:
      calculate_next_timer_intr(e);
      return;
    case 7:
      timer_synchronize(e);
      uVar3 = s_tima_mask[(e->state).timer.clock_select];
      (e->state).timer.clock_select = value & TIMER_CLOCK_16384_HZ;
      BVar7 = (e->state).timer.on;
      (e->state).timer.on = value >> 2 & TRUE;
      if (BVar7 == FALSE) {
        if ((value >> 2 & 1) == 0) {
          uVar4 = (e->state).timer.div_counter;
          bVar31 = (uVar4 & s_tima_mask[value & TIMER_CLOCK_16384_HZ]) == 0 && (uVar4 & uVar3) != 0;
        }
        else {
          bVar31 = ((e->state).timer.div_counter & uVar3) != 0;
        }
        if (bVar31) {
          increment_tima(e);
        }
      }
      goto LAB_001078f5;
    case 0xf:
      intr_synchronize(e);
      (e->state).interrupt.if_ = value & 0x1f;
      (e->state).interrupt.new_if = value & 0x1f;
      break;
    default:
      if (iVar30 == 0xff) {
        (e->state).interrupt.ie = value;
      }
    }
  }
  return;
}

Assistant:

static void write_io(Emulator* e, MaskedAddress addr, u8 value) {
  HOOK(write_io_asb, addr, get_io_reg_string(addr), value);
  switch (addr) {
    case IO_JOYP_ADDR:
      JOYP.joypad_select = UNPACK(value, JOYP_JOYPAD_SELECT);
      do_sgb(e);
      check_joyp_intr(e);
      break;
    case IO_SB_ADDR:
      serial_synchronize(e);
      SERIAL.sb = value;
#if RGBDS_LIVE
      EM_ASM({emulator.serialCallback($0);}, value);
#endif
      break;
    case IO_SC_ADDR:
      serial_synchronize(e);
      SERIAL.transferring = UNPACK(value, SC_TRANSFER_START);
      SERIAL.clock = UNPACK(value, SC_SHIFT_CLOCK);
      if (SERIAL.transferring) {
        SERIAL.tick_count = 0;
        SERIAL.transferred_bits = 0;
      }
      calculate_next_serial_intr(e);
      break;
    case IO_DIV_ADDR:
      timer_synchronize(e);
      clear_div(e);
      calculate_next_timer_intr(e);
      break;
    case IO_TIMA_ADDR:
      timer_synchronize(e);
      if (TIMER.on) {
        if (UNLIKELY(TIMER.tima_state == TIMA_STATE_OVERFLOW)) {
          /* Cancel the overflow and interrupt if written on the same tick. */
          TIMER.tima_state = TIMA_STATE_NORMAL;
          INTR.new_if &= ~IF_TIMER;
          TIMER.tima = value;
        } else if (TIMER.tima_state != TIMA_STATE_RESET) {
          /* Only update tima if it wasn't reset this tick. */
          TIMER.tima = value;
        }
        calculate_next_timer_intr(e);
      } else {
        TIMER.tima = value;
      }
      break;
    case IO_TMA_ADDR:
      timer_synchronize(e);
      TIMER.tma = value;
      if (UNLIKELY(TIMER.on && TIMER.tima_state == TIMA_STATE_RESET)) {
        TIMER.tima = value;
      }
      calculate_next_timer_intr(e);
      break;
    case IO_TAC_ADDR: {
      timer_synchronize(e);
      Bool old_timer_on = TIMER.on;
      u16 old_tima_mask = s_tima_mask[TIMER.clock_select];
      TIMER.clock_select = UNPACK(value, TAC_CLOCK_SELECT);
      TIMER.on = UNPACK(value, TAC_TIMER_ON);
      /* tima is incremented when a specific bit of div_counter transitions
       * from 1 to 0. This can happen as a result of writing to DIV, or in this
       * case modifying which bit we're looking at. */
      Bool tima_tick = FALSE;
      if (!old_timer_on) {
        u16 tima_mask = s_tima_mask[TIMER.clock_select];
        if (TIMER.on) {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0;
        } else {
          tima_tick = (TIMER.div_counter & old_tima_mask) != 0 &&
                      (TIMER.div_counter & tima_mask) == 0;
        }
        if (tima_tick) {
          increment_tima(e);
        }
      }
      calculate_next_timer_intr(e);
      break;
    }
    case IO_IF_ADDR:
      intr_synchronize(e);
      INTR.new_if = INTR.if_ = value & IF_ALL;
      break;
    case IO_LCDC_ADDR: {
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      Bool was_enabled = LCDC.display;
      LCDC.display = UNPACK(value, LCDC_DISPLAY);
      LCDC.window_tile_map_select = UNPACK(value, LCDC_WINDOW_TILE_MAP_SELECT);
      LCDC.window_display = UNPACK(value, LCDC_WINDOW_DISPLAY);
      LCDC.bg_tile_data_select = UNPACK(value, LCDC_BG_TILE_DATA_SELECT);
      LCDC.bg_tile_map_select = UNPACK(value, LCDC_BG_TILE_MAP_SELECT);
      LCDC.obj_size = UNPACK(value, LCDC_OBJ_SIZE);
      LCDC.obj_display = UNPACK(value, LCDC_OBJ_DISPLAY);
      LCDC.bg_display = UNPACK(value, LCDC_BG_DISPLAY);
      if (was_enabled ^ LCDC.display) {
        STAT.mode = PPU_MODE_HBLANK;
        PPU.ly = PPU.line_y = 0;
        if (LCDC.display) {
          check_ly_eq_lyc(e, FALSE);
          HOOK0(enable_display_v);
          PPU.state = PPU_STATE_LCD_ON_MODE2;
          PPU.state_ticks = PPU_MODE2_TICKS;
          PPU.line_start_ticks =
              ALIGN_UP(TICKS - CPU_TICK - CPU_TICK, CPU_TICK);
          PPU.display_delay_frames = PPU_ENABLE_DISPLAY_DELAY_FRAMES;
          STAT.trigger_mode = PPU_MODE_MODE2;
        } else {
          HOOK0(disable_display_v);
          /* Clear the framebuffer. */
          if (IS_SGB) {
            update_sgb_mask(e);
          } else {
            clear_frame_buffer(e, RGBA_WHITE);
          }
          e->state.event |= EMULATOR_EVENT_NEW_FRAME;
        }
        calculate_next_ppu_intr(e);
      }
      break;
    }
    case IO_STAT_ADDR: {
      ppu_synchronize(e);
      Bool new_vblank_irq = UNPACK(value, STAT_VBLANK_INTR);
      Bool new_hblank_irq = UNPACK(value, STAT_HBLANK_INTR);
      if (LCDC.display) {
        Bool hblank = TRIGGER_MODE_IS(HBLANK) && !STAT.hblank.irq;
        Bool vblank = TRIGGER_MODE_IS(VBLANK) && !STAT.vblank.irq;
        Bool y_compare = STAT.new_ly_eq_lyc && !STAT.y_compare.irq;
        if (IS_CGB) {
          /* CGB only triggers on STAT write if the value being written
           * actually sets that IRQ */
          hblank = hblank && new_hblank_irq;
          vblank = vblank && new_vblank_irq;
        }
        if (!STAT.if_ && (hblank || vblank || y_compare)) {
          HOOK(trigger_stat_from_write_cccii, y_compare ? 'Y' : '.',
               vblank ? 'V' : '.', hblank ? 'H' : '.', PPU.ly,
               TICKS + CPU_TICK);
          INTR.new_if |= IF_STAT;
          INTR.if_ |= IF_STAT;
          STAT.if_ = TRUE;
        }
      }
      STAT.y_compare.irq = UNPACK(value, STAT_YCOMPARE_INTR);
      STAT.mode2.irq = UNPACK(value, STAT_MODE2_INTR);
      STAT.vblank.irq = new_vblank_irq;
      STAT.hblank.irq = new_hblank_irq;
      calculate_next_ppu_intr(e);
      break;
    }
    case IO_SCY_ADDR:
      ppu_mode3_synchronize(e);
      PPU.scy = value;
      break;
    case IO_SCX_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.scx = value;
      break;
    case IO_LY_ADDR:
      break;
    case IO_LYC_ADDR:
      ppu_synchronize(e);
      PPU.lyc = value;
      if (LCDC.display) {
        check_ly_eq_lyc(e, TRUE);
        check_stat(e);
      }
      calculate_next_ppu_intr(e);
      break;
    case IO_DMA_ADDR:
      /* DMA can be restarted. */
      dma_synchronize(e);
      DMA.sync_ticks = TICKS;
      DMA.tick_count = 0;
      DMA.state = (DMA.state != DMA_INACTIVE ? DMA.state : DMA_TRIGGERED);
      DMA.source = value << 8;
      break;
    case IO_BGP_ADDR:
    case IO_OBP0_ADDR:
    case IO_OBP1_ADDR: {
      PaletteType type = addr - IO_BGP_ADDR;
      Palette* pal = &PPU.pal[type];
      ppu_mode3_synchronize(e);
      pal->color[3] = UNPACK(value, PALETTE_COLOR3);
      pal->color[2] = UNPACK(value, PALETTE_COLOR2);
      pal->color[1] = UNPACK(value, PALETTE_COLOR1);
      pal->color[0] = UNPACK(value, PALETTE_COLOR0);
      update_bw_palette_rgba(e, type);
      break;
    }
    case IO_WY_ADDR:
      ppu_synchronize(e);
      ppu_mode3_synchronize(e);
      PPU.wy = value;
      break;
    case IO_WX_ADDR:
      ppu_mode3_synchronize(e);
      PPU.wx = value;
      break;
    case IO_KEY1_ADDR:
      if (IS_CGB) {
        CPU_SPEED.switching = UNPACK(value, KEY1_PREPARE_SPEED_SWITCH);
      }
      break;
    case IO_VBK_ADDR:
      if (IS_CGB) {
        VRAM.bank = UNPACK(value, VBK_VRAM_BANK);
        VRAM.offset = VRAM.bank << 13;
      }
      break;
    case IO_HDMA1_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA2_ADDR:
      if (IS_CGB) {
        HDMA.source = (HDMA.source & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA3_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0x00ff) | (value << 8);
      }
      break;
    case IO_HDMA4_ADDR:
      if (IS_CGB) {
        HDMA.dest = (HDMA.dest & 0xff00) | (value & 0xf0);
      }
      break;
    case IO_HDMA5_ADDR:
      if (IS_CGB) {
        HdmaTransferMode new_mode = UNPACK(value, HDMA5_TRANSFER_MODE);
        u8 new_blocks = UNPACK(value, HDMA5_BLOCKS);
        if (HDMA.mode == HDMA_TRANSFER_MODE_HDMA &&
            (HDMA.blocks & 0x80) == 0) { /* HDMA Active */
          if (new_mode == HDMA_TRANSFER_MODE_GDMA) {
            /* Stop HDMA copy. */
            HDMA.blocks |= 0x80 | new_blocks;
          } else {
            HDMA.blocks = new_blocks;
            HDMA.mode = new_mode;
          }
        } else {
          HDMA.mode = new_mode;
          HDMA.blocks = new_blocks;
        }
        if (HDMA.mode == HDMA_TRANSFER_MODE_GDMA) {
          HDMA.state = DMA_ACTIVE;
        }
      }
      break;
    case IO_RP_ADDR:
      if (IS_CGB) {
        INFRARED.write = UNPACK(value, RP_WRITE_DATA);
        INFRARED.enabled = UNPACK(value, RP_DATA_READ_ENABLE);
      }
      break;
    case IO_BCPS_ADDR:
    case IO_OCPS_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPS_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->index = UNPACK(value, XCPS_INDEX);
        cp->auto_increment = UNPACK(value, XCPS_AUTO_INCREMENT);
      }
      break;
    case IO_BCPD_ADDR:
    case IO_OCPD_ADDR:
      if (IS_CGB) {
        ppu_mode3_synchronize(e);
        ColorPalettes* cp = addr == IO_BCPD_ADDR ? &PPU.bgcp : &PPU.obcp;
        cp->data[cp->index] = value;
        u8 palette_index = (cp->index >> 3) & 7;
        u8 color_index = (cp->index >> 1) & 3;
        u16 color16 = (cp->data[cp->index | 1] << 8) | cp->data[cp->index & ~1];
        RGBA color = unpack_cgb_color(e, color16);
        cp->palettes[palette_index].color[color_index] = color;
        if (cp->auto_increment) {
          cp->index = (cp->index + 1) & 0x3f;
        }
      }
      break;
    case IO_SVBK_ADDR:
      if (IS_CGB) {
        WRAM.bank = UNPACK(value, SVBK_WRAM_BANK);
        WRAM.offset = WRAM.bank == 0 ? 0x1000 : (WRAM.bank << 12);
      }
      break;
    case IO_IE_ADDR:
      INTR.ie = value;
      break;
    default:
      HOOK(write_io_ignored_as, addr, get_io_reg_string(addr), value);
      break;
  }
}